

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equal_to_suite::compare_null_with_real(void)

{
  bool bVar1;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_> local_239;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_> local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_> local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_> local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_> local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_> local_9;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_78,3.0);
  bVar1 = std::equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator()
                    (&local_9,&local_48,&local_78);
  boost::detail::test_impl
            ("!std::equal_to<variable>()(variable(), variable(3.0f))",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x2125,"void equal_to_suite::compare_null_with_real()",(bool)(~bVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_e8,3.0);
  bVar1 = std::equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator()
                    (local_85,&local_b8,&local_e8);
  boost::detail::test_impl
            ("!std::equal_to<variable>()(variable(), variable(3.0))",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x2126,"void equal_to_suite::compare_null_with_real()",(bool)(~bVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_158,(longdouble)3.0);
  bVar1 = std::equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator()
                    (&local_e9,&local_128,&local_158);
  boost::detail::test_impl
            ("!std::equal_to<variable>()(variable(), variable(3.0L))",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x2127,"void equal_to_suite::compare_null_with_real()",(bool)(~bVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_1c8,3.0);
  bVar1 = std::equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator()
                    (&local_159,&local_198,&local_1c8);
  boost::detail::test_impl
            ("!std::equal_to<variable>()(variable(), 3.0f)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x2129,"void equal_to_suite::compare_null_with_real()",(bool)(~bVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_238,3.0);
  bVar1 = std::equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator()
                    (&local_1c9,&local_208,&local_238);
  boost::detail::test_impl
            ("!std::equal_to<variable>()(variable(), 3.0)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x212a,"void equal_to_suite::compare_null_with_real()",(bool)(~bVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_2a8,(longdouble)3.0);
  bVar1 = std::equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator()
                    (&local_239,&local_278,&local_2a8);
  boost::detail::test_impl
            ("!std::equal_to<variable>()(variable(), 3.0L)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x212b,"void equal_to_suite::compare_null_with_real()",(bool)(~bVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_278);
  return;
}

Assistant:

void compare_null_with_real()
{
    TRIAL_PROTOCOL_TEST(!std::equal_to<variable>()(variable(), variable(3.0f)));
    TRIAL_PROTOCOL_TEST(!std::equal_to<variable>()(variable(), variable(3.0)));
    TRIAL_PROTOCOL_TEST(!std::equal_to<variable>()(variable(), variable(3.0L)));

    TRIAL_PROTOCOL_TEST(!std::equal_to<variable>()(variable(), 3.0f));
    TRIAL_PROTOCOL_TEST(!std::equal_to<variable>()(variable(), 3.0));
    TRIAL_PROTOCOL_TEST(!std::equal_to<variable>()(variable(), 3.0L));
}